

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_setuservalue(lua_State *L,int idx)

{
  ushort uVar1;
  int iVar2;
  lua_CFunction p_Var3;
  StkId pTVar4;
  GCObject *o;
  GCObject *v;
  int *piVar5;
  TValue *pTVar6;
  char *pcVar7;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4ce,"void lua_setuservalue(lua_State *, int)");
  }
  if ((long)L->top - (long)L->ci->func < 0x11) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4cf,"void lua_setuservalue(lua_State *, int)");
  }
  pTVar6 = index2addr(L,idx);
  if (pTVar6->tt_ != 0x8007) {
    __assert_fail("(((((o))->tt_) == (((7) | (1 << 15))))) && \"full userdata expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4d1,"void lua_setuservalue(lua_State *, int)");
  }
  p_Var3 = (pTVar6->value_).f;
  if (p_Var3[8] == (_func_int_lua_State_ptr)0x7) {
    pTVar4 = L->top;
    *(Value *)(p_Var3 + 0x20) = pTVar4[-1].value_;
    uVar1 = pTVar4[-1].tt_;
    *(ushort *)(p_Var3 + 10) = uVar1;
    if ((-1 < (short)uVar1) ||
       (((uVar1 & 0x7f) == (ushort)(pTVar4[-1].value_.gc)->tt &&
        ((L == (lua_State *)0x0 ||
         (((pTVar4[-1].value_.gc)->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))))) {
      if ((short)L->top[-1].tt_ < 0) {
        if (-1 < (short)pTVar6->tt_) {
          pcVar7 = "(((o)->tt_) & (1 << 15))";
LAB_001141f7:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x4d3,"void lua_setuservalue(lua_State *, int)");
        }
        o = (pTVar6->value_).gc;
        if (((o->marked & 0x20) != 0) && (v = L->top[-1].value_.gc, (v->marked & 0x18) != 0)) {
          if (9 < (o->tt & 0xe)) {
            pcVar7 = 
            "((((((void) sizeof (((((o)->tt_) & (1 << 15))) ? 1 : 0), __extension__ ({ if ((((o)->tt_) & (1 << 15))) ; else __assert_fail (\"(((o)->tt_) & (1 << 15))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c\", 1235, __extension__ __PRETTY_FUNCTION__); })), (((o)->value_).gc)))->tt) & 0x0F) < (9+1)"
            ;
            goto LAB_001141f7;
          }
          luaC_barrier_(L,o,v);
        }
      }
      L->top = L->top + -1;
      piVar5 = *(int **)&L[-1].hookmask;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        return;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x4d5,"void lua_setuservalue(lua_State *, int)");
    }
    pcVar7 = "0";
  }
  else {
    pcVar7 = "(((o)->value_).gc)->tt == 7";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x4d2,"void lua_setuservalue(lua_State *, int)");
}

Assistant:

LUA_API void lua_setuservalue (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  setuservalue(L, uvalue(o), L->top - 1);
  luaC_barrier(L, gcvalue(o), L->top - 1); /* Note this is different from Lua 5.4 where userdata is treated like a table */
  L->top--;
  lua_unlock(L);
}